

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualMaterial.cpp
# Opt level: O3

shared_ptr<chrono::ChVisualMaterial> chrono::ChVisualMaterial::Default(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  element_type *in_RDI;
  shared_ptr<chrono::ChVisualMaterial> sVar3;
  undefined1 local_29;
  ChVisualMaterial *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (default_material == (ChVisualMaterial *)0x0) {
    local_28 = (ChVisualMaterial *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChVisualMaterial,std::allocator<chrono::ChVisualMaterial>>
              (a_Stack_20,&local_28,(allocator<chrono::ChVisualMaterial> *)&local_29);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    default_material = local_28;
    p_Var1 = DAT_00b6c378;
    local_28 = (ChVisualMaterial *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_00b6c378 = _Var2._M_pi;
    in_RDX._M_pi = extraout_RDX;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       in_RDX._M_pi = extraout_RDX_00,
       a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
      in_RDX._M_pi = extraout_RDX_01;
    }
  }
  *(ChVisualMaterial **)&in_RDI->Ka = default_material;
  p_Var1 = DAT_00b6c378;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDI->Ka).B = DAT_00b6c378;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar3.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar3.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<chrono::ChVisualMaterial>)
         sVar3.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChVisualMaterial> ChVisualMaterial::Default() {
    if (!default_material) {
        default_material = chrono_types::make_shared<ChVisualMaterial>();
    }

    return default_material;
}